

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

bool __thiscall CLI::Option::check_name(Option *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  size_type sVar3;
  pointer pcVar4;
  size_t sVar5;
  size_t __n;
  bool bVar6;
  int iVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  string local_name;
  string local_pname;
  undefined1 local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  long local_128;
  char local_120;
  undefined7 uStack_11f;
  undefined8 uStack_118;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  long local_108;
  char local_100;
  undefined7 uStack_ff;
  undefined8 uStack_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (((name->_M_string_length < 3) || (pcVar2 = (name->_M_dataplus)._M_p, *pcVar2 != '-')) ||
     (pcVar2[1] != '-')) {
    if ((name->_M_string_length < 2) || (*(name->_M_dataplus)._M_p != '-')) {
      sVar3 = (this->pname_)._M_string_length;
      if (sVar3 != 0) {
        pcVar4 = (this->pname_)._M_dataplus._M_p;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        ::std::__cxx11::string::_M_construct<char*>((string *)&local_90,pcVar4,pcVar4 + sVar3);
        pcVar4 = (name->_M_dataplus)._M_p;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar4,pcVar4 + name->_M_string_length);
        if ((this->super_OptionBase<CLI::Option>).ignore_underscore_ == true) {
          local_110._M_current = &local_100;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_110,local_90._M_dataplus._M_p,
                     local_90._M_dataplus._M_p + local_90._M_string_length);
          local_151 = 0x5f;
          _Var8 = ::std::
                  __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            (local_110,local_110._M_current + local_108,
                             (_Iter_equals_val<const_char>)&local_151);
          local_150._M_string_length = (long)_Var8._M_current - (long)local_110._M_current;
          *_Var8._M_current = '\0';
          paVar1 = &local_150.field_2;
          if (local_110._M_current == &local_100) {
            local_150.field_2._8_8_ = uStack_f8;
            local_150._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_150._M_dataplus._M_p = local_110._M_current;
          }
          local_150.field_2._M_allocated_capacity._1_7_ = uStack_ff;
          local_150.field_2._M_local_buf[0] = local_100;
          local_108 = 0;
          local_100 = '\0';
          local_110._M_current = &local_100;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_90,&local_150);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != paVar1) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          if (local_110._M_current != &local_100) {
            operator_delete(local_110._M_current,CONCAT71(uStack_ff,local_100) + 1);
          }
          local_130._M_current = &local_120;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_130,local_b0._M_dataplus._M_p,
                     local_b0._M_dataplus._M_p + local_b0._M_string_length);
          local_151 = 0x5f;
          _Var8 = ::std::
                  __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            (local_130,local_130._M_current + local_128,
                             (_Iter_equals_val<const_char>)&local_151);
          local_150._M_string_length = (long)_Var8._M_current - (long)local_130._M_current;
          *_Var8._M_current = '\0';
          if (local_130._M_current == &local_120) {
            local_150.field_2._8_8_ = uStack_118;
            local_150._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_150._M_dataplus._M_p = local_130._M_current;
          }
          local_150.field_2._M_allocated_capacity._1_7_ = uStack_11f;
          local_150.field_2._M_local_buf[0] = local_120;
          local_128 = 0;
          local_120 = '\0';
          local_130._M_current = &local_120;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_b0,&local_150);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != paVar1) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          if (local_130._M_current != &local_120) {
            operator_delete(local_130._M_current,CONCAT71(uStack_11f,local_120) + 1);
          }
        }
        if ((this->super_OptionBase<CLI::Option>).ignore_case_ == true) {
          local_d0 = &local_c0;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,local_90._M_dataplus._M_p,
                     local_90._M_dataplus._M_p + local_90._M_string_length);
          ::std::
          transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                    (local_d0,local_d0->_M_local_buf + local_c8,local_d0);
          paVar1 = &local_150.field_2;
          if (local_d0 == &local_c0) {
            local_150.field_2._8_8_ = local_c0._8_8_;
            local_150._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_150._M_dataplus._M_p = (pointer)local_d0;
          }
          local_150.field_2._M_allocated_capacity._1_7_ = local_c0._M_allocated_capacity._1_7_;
          local_150.field_2._M_local_buf[0] = local_c0._M_local_buf[0];
          local_150._M_string_length = local_c8;
          local_c8 = 0;
          local_c0._M_local_buf[0] = '\0';
          local_d0 = &local_c0;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_90,&local_150);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != paVar1) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          if (local_d0 != &local_c0) {
            operator_delete(local_d0,CONCAT71(local_c0._M_allocated_capacity._1_7_,
                                              local_c0._M_local_buf[0]) + 1);
          }
          local_f0 = &local_e0;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f0,local_b0._M_dataplus._M_p,
                     local_b0._M_dataplus._M_p + local_b0._M_string_length);
          ::std::
          transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                    (local_f0,local_f0->_M_local_buf + local_e8,local_f0);
          if (local_f0 == &local_e0) {
            local_150.field_2._8_8_ = local_e0._8_8_;
            local_150._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_150._M_dataplus._M_p = (pointer)local_f0;
          }
          local_150.field_2._M_allocated_capacity._1_7_ = local_e0._M_allocated_capacity._1_7_;
          local_150.field_2._M_local_buf[0] = local_e0._M_local_buf[0];
          local_150._M_string_length = local_e8;
          local_e8 = 0;
          local_e0._M_local_buf[0] = '\0';
          local_f0 = &local_e0;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_b0,&local_150);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != paVar1) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          if (local_f0 != &local_e0) {
            operator_delete(local_f0,CONCAT71(local_e0._M_allocated_capacity._1_7_,
                                              local_e0._M_local_buf[0]) + 1);
          }
        }
        bVar6 = true;
        if (local_b0._M_string_length == local_90._M_string_length) {
          if (local_b0._M_string_length == 0) {
            bVar6 = false;
          }
          else {
            iVar7 = bcmp(local_b0._M_dataplus._M_p,local_90._M_dataplus._M_p,
                         local_b0._M_string_length);
            bVar6 = iVar7 != 0;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (!bVar6) {
          return true;
        }
      }
      sVar5 = (this->envname_)._M_string_length;
      if ((sVar5 != 0) && (__n = name->_M_string_length, __n == sVar5)) {
        if (__n != 0) {
          iVar7 = bcmp((name->_M_dataplus)._M_p,(this->envname_)._M_dataplus._M_p,__n);
          return iVar7 == 0;
        }
        return true;
      }
      return false;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_70,name,1,0xffffffffffffffff);
    bVar6 = check_sname(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return bVar6;
    }
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_50,name,2,0xffffffffffffffff);
    bVar6 = check_lname(this,&local_50);
    local_70.field_2._M_allocated_capacity = local_50.field_2._M_allocated_capacity;
    local_70._M_dataplus._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return bVar6;
    }
  }
  operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  return bVar6;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE bool Option::check_name(const std::string &name) const {

    if(name.length() > 2 && name[0] == '-' && name[1] == '-')
        return check_lname(name.substr(2));
    if(name.length() > 1 && name.front() == '-')
        return check_sname(name.substr(1));
    if(!pname_.empty()) {
        std::string local_pname = pname_;
        std::string local_name = name;
        if(ignore_underscore_) {
            local_pname = detail::remove_underscore(local_pname);
            local_name = detail::remove_underscore(local_name);
        }
        if(ignore_case_) {
            local_pname = detail::to_lower(local_pname);
            local_name = detail::to_lower(local_name);
        }
        if(local_name == local_pname) {
            return true;
        }
    }

    if(!envname_.empty()) {
        // this needs to be the original since envname_ shouldn't match on case insensitivity
        return (name == envname_);
    }
    return false;
}